

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skein.c
# Opt level: O2

int Skein_512_Final_Pad(Skein_512_Ctxt_t *ctx,u08b_t *hashVal)

{
  byte *pbVar1;
  u64b_t uVar2;
  u64b_t uVar3;
  u64b_t uVar4;
  u64b_t uVar5;
  u64b_t uVar6;
  u64b_t uVar7;
  u64b_t uVar8;
  ulong byteCntAdd;
  
  pbVar1 = (byte *)((long)(ctx->h).T + 0xf);
  *pbVar1 = *pbVar1 | 0x80;
  byteCntAdd = (ctx->h).bCnt;
  if (byteCntAdd < 0x40) {
    memset(ctx->b + byteCntAdd,0,0x40 - byteCntAdd);
    byteCntAdd = (ctx->h).bCnt;
  }
  Skein_512_Process_Block(ctx,ctx->b,1,byteCntAdd);
  uVar2 = ctx->X[0];
  uVar3 = ctx->X[1];
  uVar4 = ctx->X[2];
  uVar5 = ctx->X[3];
  uVar6 = ctx->X[4];
  uVar7 = ctx->X[5];
  uVar8 = ctx->X[7];
  *(u64b_t *)(hashVal + 0x30) = ctx->X[6];
  *(u64b_t *)(hashVal + 0x38) = uVar8;
  *(u64b_t *)(hashVal + 0x20) = uVar6;
  *(u64b_t *)(hashVal + 0x28) = uVar7;
  *(u64b_t *)(hashVal + 0x10) = uVar4;
  *(u64b_t *)(hashVal + 0x18) = uVar5;
  *(u64b_t *)hashVal = uVar2;
  *(u64b_t *)(hashVal + 8) = uVar3;
  return 0;
}

Assistant:

int Skein_512_Final_Pad(Skein_512_Ctxt_t *ctx, u08b_t *hashVal)
{
    Skein_Assert(ctx->h.bCnt <= SKEIN_512_BLOCK_BYTES,SKEIN_FAIL);    /* catch uninitialized context */

    ctx->h.T[1] |= SKEIN_T1_FLAG_FINAL;        /* tag as the final block */
    if (ctx->h.bCnt < SKEIN_512_BLOCK_BYTES)   /* zero pad b[] if necessary */
        memset(&ctx->b[ctx->h.bCnt],0,SKEIN_512_BLOCK_BYTES - ctx->h.bCnt);
    Skein_512_Process_Block(ctx,ctx->b,1,ctx->h.bCnt);    /* process the final block */

    Skein_Put64_LSB_First(hashVal,ctx->X,SKEIN_512_BLOCK_BYTES);   /* "output" the state bytes */

    return SKEIN_SUCCESS;
}